

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O3

void anon_unknown.dwarf_2fa151::writeRead
               (string *tempDir,Array2D<unsigned_int> *pi,Array2D<Imath_3_2::half> *ph,
               Array2D<float> *pf,int w,int h,int xs,int ys,int dx,int dy)

{
  float fVar1;
  long lVar2;
  int iVar3;
  _Alloc_hider __filename;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ostream *poVar10;
  Compression *pCVar11;
  undefined4 *puVar12;
  char *pcVar13;
  int *piVar14;
  void *pvVar15;
  void *pvVar16;
  void *pvVar17;
  undefined8 *puVar18;
  undefined8 *puVar19;
  float *pfVar20;
  float *pfVar21;
  _Rb_tree_node_base *p_Var22;
  _Rb_tree_node_base *p_Var23;
  _Rb_tree_node_base *p_Var24;
  void *pvVar25;
  char *pcVar26;
  char *pcVar27;
  undefined4 uVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  char *pcVar34;
  uint uVar35;
  void *pvVar36;
  ulong uVar37;
  half *phVar38;
  undefined4 in_register_00000084;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  void *pvVar45;
  char *pcVar46;
  uint uVar47;
  long lVar48;
  long lVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  int iVar58;
  Compression local_224;
  long local_220;
  Array2D<Imath_3_2::half> ph4;
  char *local_1e0;
  FrameBuffer fb;
  int local_1a0;
  void *local_180;
  int local_158;
  long local_150;
  void *local_148;
  Header hdr;
  long local_c8;
  string filename;
  TiledOutputFile out;
  int iStack_94;
  undefined8 uStack_90;
  TiledInputFile in;
  
  lVar39 = CONCAT44(in_register_00000084,w);
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&filename,tempDir,(long)&(tempDir->_M_dataplus)._M_p + (long)&pi->_sizeX);
  std::__cxx11::string::append((char *)&filename);
  lVar8 = (long)-xs;
  lVar9 = (long)-h;
  local_224 = NO_COMPRESSION;
  do {
    __filename._M_p = filename._M_dataplus._M_p;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"compression ",0xc);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,local_224);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
    std::ostream::flush();
    _out = 0;
    fb._map._M_t._M_impl._4_4_ = xs;
    ph4._sizeX = 0;
    fb._map._M_t._M_impl._0_4_ = h;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = h + 0xaa;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = xs + 0x3a;
    Imf_3_2::Header::Header
              (&hdr,(Box *)&out,(Box *)&fb,1.0,(Vec2 *)&ph4,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pCVar11 = (Compression *)Imf_3_2::Header::compression();
    *pCVar11 = local_224;
    puVar12 = (undefined4 *)Imf_3_2::Header::lineOrder();
    *puVar12 = 0;
    pcVar13 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,UINT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar13,(Channel *)0x1ca211);
    pcVar13 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,HALF,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar13,(Channel *)0x1ca214);
    pcVar13 = (char *)Imf_3_2::Header::channels();
    Imf_3_2::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
    Imf_3_2::ChannelList::insert(pcVar13,(Channel *)0x1ca217);
    _out = 0xf0000000f;
    uStack_90 = 0;
    Imf_3_2::Header::setTileDescription((TileDescription *)&hdr);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)(ph->_data + ph->_sizeY * lVar8 * 2 + lVar9 * 2),4,0x2ac,1
               ,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca211);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pf->_data + lVar9 * 2 + pf->_sizeY * lVar8 * 2),2,
               0x156,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,
               (char *)(*(long *)(lVar39 + 8) * lVar8 * 4 + *(long *)(lVar39 + 0x10) + lVar9 * 4),4,
               0x2ac,1,1,0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca217);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," writing",8);
    std::ostream::flush();
    remove(__filename._M_p);
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile(&out,__filename._M_p,&hdr,iVar5);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&out);
    iVar7 = (int)(Channel *)&out;
    iVar5 = Imf_3_2::TiledOutputFile::numXTiles(iVar7);
    iVar6 = Imf_3_2::TiledOutputFile::numYTiles(iVar7);
    Imf_3_2::TiledOutputFile::writeTiles(iVar7,0,iVar5 + -1,0,iVar6 + -1);
    Imf_3_2::TiledOutputFile::~TiledOutputFile(&out);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading (whole file)",0x16);
    std::ostream::flush();
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile(&in,__filename._M_p,iVar5);
    Imf_3_2::TiledInputFile::header();
    piVar14 = (int *)Imf_3_2::Header::dataWindow();
    iVar5 = piVar14[2];
    lVar49 = (long)*piVar14;
    uVar40 = (iVar5 - lVar49) + 1;
    iVar6 = piVar14[1];
    lVar30 = (long)piVar14[3] - (long)iVar6;
    uVar43 = lVar30 + 1;
    uVar32 = uVar43 * uVar40;
    uVar44 = -(ulong)(uVar32 >> 0x3e != 0) | uVar32 * 4;
    pvVar15 = operator_new__(uVar44);
    uVar37 = uVar32 * 2;
    if ((long)uVar32 < 0) {
      uVar37 = 0xffffffffffffffff;
    }
    pvVar16 = operator_new__(uVar37);
    pvVar17 = operator_new__(uVar44);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    lVar48 = -(long)iVar6 * uVar40;
    uVar37 = uVar40 * 4;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,UINT,(char *)((long)pvVar15 + lVar49 * -4 + lVar48 * 4),4,uVar37,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca211);
    uVar32 = uVar40 * 2;
    Imf_3_2::Slice::Slice
              ((Slice *)&out,HALF,(char *)((long)pvVar16 + lVar49 * -2 + lVar48 * 2),2,uVar32,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
    Imf_3_2::Slice::Slice
              ((Slice *)&out,FLOAT,(char *)((long)pvVar17 + lVar49 * -4 + lVar48 * 4),4,uVar37,1,1,
               0.0,false,false);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca217);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&in);
    iVar58 = (int)&in;
    iVar6 = Imf_3_2::TiledInputFile::numXTiles(iVar58);
    iVar7 = Imf_3_2::TiledInputFile::numYTiles(iVar58);
    uVar28 = 0;
    Imf_3_2::TiledInputFile::readTiles(iVar58,0,iVar6 + -1,0,iVar7 + -1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", comparing (whole file)",0x18);
    std::ostream::flush();
    Imf_3_2::TiledInputFile::header();
    puVar18 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar19 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar6 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar7 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar50._4_4_ = iVar6;
    auVar50._0_4_ = iVar6;
    auVar50._8_4_ = iVar7;
    auVar50._12_4_ = iVar7;
    iVar6 = movmskpd(uVar28,auVar50);
    if ((iVar6 != 3) ||
       (iVar7 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar58 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar51._4_4_ = iVar7, auVar51._0_4_ = iVar7, auVar51._8_4_ = iVar58, auVar51._12_4_ = iVar58
       , iVar7 = movmskpd((int)puVar19,auVar51), iVar7 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10a,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar7 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar58 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar52._4_4_ = iVar7;
    auVar52._0_4_ = iVar7;
    auVar52._8_4_ = iVar58;
    auVar52._12_4_ = iVar58;
    iVar6 = movmskpd(iVar6,auVar52);
    if ((iVar6 != 3) ||
       (iVar6 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar7 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar53._4_4_ = iVar6, auVar53._0_4_ = iVar6, auVar53._8_4_ = iVar7, auVar53._12_4_ = iVar7,
       iVar6 = movmskpd((int)puVar19,auVar53), iVar6 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar20;
    pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar20) || (NAN(fVar1) || NAN(*pfVar20))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar21 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar20 != *pfVar21) || (NAN(*pfVar20) || NAN(*pfVar21))) || (pfVar20[1] != pfVar21[1]))
       || (NAN(pfVar20[1]) || NAN(pfVar21[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10e,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar20;
    pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar20) || (NAN(fVar1) || NAN(*pfVar20))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x10f,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    iVar6 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar6 != *piVar14) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x110,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar14 = (int *)Imf_3_2::Header::compression();
    iVar6 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::compression();
    if (iVar6 != *piVar14) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x111,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var22 == p_Var24) break;
      iVar6 = strcmp((char *)(p_Var22 + 1),(char *)(p_Var23 + 1));
      if (iVar6 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x118,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var22[9]._M_color != p_Var23[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x119,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var22[9].field_0x4 != *(int *)&p_Var23[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var22[9]._M_parent != *(int *)&p_Var23[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x11b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var23 != p_Var22) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x121,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    local_158 = (int)lVar30;
    local_1a0 = (int)(iVar5 - lVar49);
    if ((PXR24_COMPRESSION < local_224) && (-1 < local_158)) {
      local_c8 = 0;
      uVar44 = uVar43 & 0xffffffff;
      local_150 = 0;
      local_148 = pvVar16;
      do {
        uVar29 = (uint)uVar44;
        uVar42 = 0xf;
        if ((int)uVar29 < 0xf) {
          uVar42 = uVar29;
        }
        if ((int)uVar42 < 2) {
          uVar42 = 1;
        }
        if (-1 < local_1a0) {
          iVar6 = (int)(uVar43 - local_150);
          iVar5 = 0xf;
          if (iVar6 < 0xf) {
            iVar5 = iVar6;
          }
          lVar30 = (long)iVar5;
          lVar49 = 0;
          local_180 = local_148;
          uVar44 = uVar40 & 0xffffffff;
          lVar48 = 0;
          do {
            uVar35 = (uint)uVar44;
            lVar33 = 0xf;
            if ((long)(int)uVar35 < 0xf) {
              lVar33 = (long)(int)uVar35;
            }
            uVar47 = 0xf;
            if ((int)uVar35 < 0xf) {
              uVar47 = uVar35;
            }
            if ((int)uVar47 < 2) {
              uVar47 = 1;
            }
            iVar7 = (int)(uVar40 - lVar48);
            iVar6 = 0xf;
            if (iVar7 < 0xf) {
              iVar6 = iVar7;
            }
            uStack_90 = (long)iVar6;
            uVar44 = uStack_90 * lVar30 * 2;
            if (uStack_90 * lVar30 < 0) {
              uVar44 = 0xffffffffffffffff;
            }
            _out = lVar30;
            pvVar25 = operator_new__(uVar44);
            ph4._sizeX = lVar30;
            ph4._sizeY = uStack_90;
            ph4._data = (half *)operator_new__(uVar44);
            if (0 < (long)(uVar43 - local_150)) {
              lVar2 = pf->_sizeY;
              lVar31 = local_c8 * lVar2 + lVar49 + (long)pf->_data;
              uVar44 = 0;
              pvVar36 = local_180;
              phVar38 = ph4._data;
              pvVar45 = pvVar25;
              do {
                if (0 < (long)(uVar40 - lVar48)) {
                  uVar41 = 0;
                  do {
                    *(undefined2 *)((long)pvVar45 + uVar41 * 2) =
                         *(undefined2 *)(lVar31 + uVar41 * 2);
                    phVar38[uVar41]._h = *(uint16_t *)((long)pvVar36 + uVar41 * 2);
                    uVar41 = uVar41 + 1;
                  } while (uVar47 != uVar41);
                }
                uVar44 = uVar44 + 1;
                phVar38 = phVar38 + lVar33;
                pvVar45 = (void *)((long)pvVar45 + lVar33 * 2);
                pvVar36 = (void *)((long)pvVar36 + uVar32);
                lVar31 = lVar31 + lVar2 * 2;
              } while (uVar44 != uVar42);
            }
            if (((local_224 & (DWAA_COMPRESSION|B44_COMPRESSION)) != B44_COMPRESSION) ||
               (compareB44(iVar6,iVar5,(Array2D<Imath_3_2::half> *)&out,&ph4),
               ph4._data != (half *)0x0)) {
              operator_delete__(ph4._data);
            }
            if (pvVar25 != (void *)0x0) {
              operator_delete__(pvVar25);
            }
            lVar48 = lVar48 + 0xf;
            uVar44 = (ulong)(uVar35 - 0xf);
            local_180 = (void *)((long)local_180 + 0x1e);
            lVar49 = lVar49 + 0x1e;
          } while ((int)lVar48 <= local_1a0);
        }
        local_150 = local_150 + 0xf;
        uVar44 = (ulong)(uVar29 - 0xf);
        local_148 = (void *)((long)local_148 + uVar40 * 0x1e);
        local_c8 = local_c8 + 0x1e;
      } while ((int)local_150 <= local_158);
    }
    if (-1 < local_158) {
      lVar30 = 0;
      local_220 = 0;
      uVar44 = 0;
      pvVar25 = pvVar16;
      pvVar36 = pvVar17;
      pvVar45 = pvVar15;
      do {
        if (-1 < local_1a0) {
          uVar41 = 0;
          do {
            if (*(int *)((long)&ph->_data[uVar41 * 2]._h + ph->_sizeY * lVar30) !=
                *(int *)((long)pvVar45 + uVar41 * 4)) {
              __assert_fail("pi1[y][x] == pi2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14a,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            if ((local_224 < B44_COMPRESSION) &&
               ((fVar1 = *(float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)
                                           ((long)pf->_data + uVar41 * 2 + pf->_sizeY * local_220) *
                                   4),
                pfVar20 = (float *)(_imath_half_to_float_table +
                                   (ulong)*(ushort *)((long)pvVar25 + uVar41 * 2) * 4),
                fVar1 != *pfVar20 || (NAN(fVar1) || NAN(*pfVar20))))) {
              __assert_fail("ph1[y][x] == ph2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x14f,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            bVar4 = equivalent(*(float *)(*(long *)(lVar39 + 8) * lVar30 + *(long *)(lVar39 + 0x10)
                                         + uVar41 * 4),*(float *)((long)pvVar36 + uVar41 * 4),
                               local_224);
            if (!bVar4) {
              __assert_fail("equivalent (pf1[y][x], pf2[y][x], comp)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                            ,0x152,
                            "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                           );
            }
            uVar41 = uVar41 + 1;
          } while ((uVar40 & 0xffffffff) != uVar41);
        }
        uVar44 = uVar44 + 1;
        pvVar25 = (void *)((long)pvVar25 + uVar32);
        local_220 = local_220 + 2;
        pvVar36 = (void *)((long)pvVar36 + uVar37);
        lVar30 = lVar30 + 4;
        pvVar45 = (void *)((long)pvVar45 + uVar37);
      } while (uVar44 != (uVar43 & 0xffffffff));
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    operator_delete__(pvVar17);
    operator_delete__(pvVar16);
    operator_delete__(pvVar15);
    Imf_3_2::TiledInputFile::~TiledInputFile(&in);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,", reading and comparing (tile-by-tile)",0x26);
    std::ostream::flush();
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledInputFile::TiledInputFile((TiledInputFile *)&ph4,__filename._M_p,iVar5);
    pcVar13 = (char *)operator_new__(900);
    pcVar26 = (char *)operator_new__(0x1c2);
    pcVar27 = (char *)operator_new__(900);
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &fb._map._M_t._M_impl.super__Rb_tree_header._M_header;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Imf_3_2::Slice::Slice((Slice *)&out,UINT,pcVar13,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca211);
    Imf_3_2::Slice::Slice((Slice *)&out,HALF,pcVar26,2,0x1e,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca214);
    uVar28 = 4;
    Imf_3_2::Slice::Slice((Slice *)&out,FLOAT,pcVar27,4,0x3c,1,1,0.0,true,true);
    Imf_3_2::FrameBuffer::insert((char *)&fb,(Slice *)0x1ca217);
    Imf_3_2::TiledInputFile::setFrameBuffer((FrameBuffer *)&ph4);
    Imf_3_2::TiledInputFile::header();
    puVar18 = (undefined8 *)Imf_3_2::Header::displayWindow();
    puVar19 = (undefined8 *)Imf_3_2::Header::displayWindow();
    iVar5 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar6 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar54._4_4_ = iVar5;
    auVar54._0_4_ = iVar5;
    auVar54._8_4_ = iVar6;
    auVar54._12_4_ = iVar6;
    iVar5 = movmskpd(uVar28,auVar54);
    if ((iVar5 != 3) ||
       (iVar6 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar7 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar55._4_4_ = iVar6, auVar55._0_4_ = iVar6, auVar55._8_4_ = iVar7, auVar55._12_4_ = iVar7,
       iVar6 = movmskpd((int)puVar19,auVar55), iVar6 != 3)) {
      __assert_fail("in.header ().displayWindow () == hdr.displayWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18b,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    puVar18 = (undefined8 *)Imf_3_2::Header::dataWindow();
    puVar19 = (undefined8 *)Imf_3_2::Header::dataWindow();
    iVar6 = -(uint)((int)*puVar19 == (int)*puVar18);
    iVar7 = -(uint)((int)((ulong)*puVar19 >> 0x20) == (int)((ulong)*puVar18 >> 0x20));
    auVar56._4_4_ = iVar6;
    auVar56._0_4_ = iVar6;
    auVar56._8_4_ = iVar7;
    auVar56._12_4_ = iVar7;
    iVar5 = movmskpd(iVar5,auVar56);
    if ((iVar5 != 3) ||
       (iVar5 = -(uint)((int)puVar19[1] == (int)puVar18[1]),
       iVar6 = -(uint)((int)((ulong)puVar19[1] >> 0x20) == (int)((ulong)puVar18[1] >> 0x20)),
       auVar57._4_4_ = iVar5, auVar57._0_4_ = iVar5, auVar57._8_4_ = iVar6, auVar57._12_4_ = iVar6,
       iVar5 = movmskpd((int)puVar19,auVar57), iVar5 != 3)) {
      __assert_fail("in.header ().dataWindow () == hdr.dataWindow ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18c,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
    fVar1 = *pfVar20;
    pfVar20 = (float *)Imf_3_2::Header::pixelAspectRatio();
    if ((fVar1 != *pfVar20) || (NAN(fVar1) || NAN(*pfVar20))) {
      __assert_fail("in.header ().pixelAspectRatio () == hdr.pixelAspectRatio ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x18d,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowCenter();
    pfVar21 = (float *)Imf_3_2::Header::screenWindowCenter();
    if ((((*pfVar20 != *pfVar21) || (NAN(*pfVar20) || NAN(*pfVar21))) || (pfVar20[1] != pfVar21[1]))
       || (NAN(pfVar20[1]) || NAN(pfVar21[1]))) {
      __assert_fail("in.header ().screenWindowCenter () == hdr.screenWindowCenter ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,399,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
    fVar1 = *pfVar20;
    pfVar20 = (float *)Imf_3_2::Header::screenWindowWidth();
    if ((fVar1 != *pfVar20) || (NAN(fVar1) || NAN(*pfVar20))) {
      __assert_fail("in.header ().screenWindowWidth () == hdr.screenWindowWidth ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,400,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    iVar5 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::lineOrder();
    if (iVar5 != *piVar14) {
      __assert_fail("in.header ().lineOrder () == hdr.lineOrder ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x191,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::TiledInputFile::header();
    piVar14 = (int *)Imf_3_2::Header::compression();
    iVar5 = *piVar14;
    piVar14 = (int *)Imf_3_2::Header::compression();
    if (iVar5 != *piVar14) {
      __assert_fail("in.header ().compression () == hdr.compression ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x192,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var23 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
    while( true ) {
      Imf_3_2::Header::channels();
      p_Var24 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
      if (p_Var22 == p_Var24) break;
      iVar5 = strcmp((char *)(p_Var22 + 1),(char *)(p_Var23 + 1));
      if (iVar5 != 0) {
        __assert_fail("!strcmp (hi.name (), ii.name ())",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x199,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (p_Var22[9]._M_color != p_Var23[9]._M_color) {
        __assert_fail("hi.channel ().type == ii.channel ().type",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19a,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var22[9].field_0x4 != *(int *)&p_Var23[9].field_0x4) {
        __assert_fail("hi.channel ().xSampling == ii.channel ().xSampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19b,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      if (*(int *)&p_Var22[9]._M_parent != *(int *)&p_Var23[9]._M_parent) {
        __assert_fail("hi.channel ().ySampling == ii.channel ().ySampling",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                      ,0x19c,
                      "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                     );
      }
      p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22);
      p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
    }
    Imf_3_2::TiledInputFile::header();
    Imf_3_2::Header::channels();
    p_Var22 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
    if (p_Var23 != p_Var22) {
      __assert_fail("ii == in.header ().channels ().end ()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                    ,0x1a2,
                    "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                   );
    }
    for (iVar5 = 0; iVar6 = Imf_3_2::TiledInputFile::numYTiles((int)&ph4), iVar5 < iVar6;
        iVar5 = iVar5 + 1) {
      iVar6 = 0;
      while( true ) {
        iVar58 = (int)&ph4;
        iVar7 = Imf_3_2::TiledInputFile::numXTiles(iVar58);
        if (iVar7 <= iVar6) break;
        Imf_3_2::TiledInputFile::readTile(iVar58,iVar6,iVar5);
        Imf_3_2::TiledInputFile::dataWindowForTile((int)&out,iVar58,iVar6);
        if (iStack_94 <= uStack_90._4_4_) {
          lVar30 = (long)(_out - h);
          local_220 = (long)(iStack_94 - xs) * 2;
          lVar49 = (long)(iStack_94 - xs) << 2;
          uVar40 = 0;
          pcVar34 = pcVar13;
          pcVar46 = pcVar27;
          iVar7 = iStack_94;
          local_1e0 = pcVar26;
          do {
            iVar58 = _out;
            if (_out <= (int)uStack_90) {
              uVar43 = 0;
              do {
                if (*(int *)((long)&ph->_data[lVar30 * 2 + uVar43 * 2]._h + ph->_sizeY * lVar49) !=
                    *(int *)(pcVar34 + uVar43 * 4)) {
                  __assert_fail("pi1[oY + y][oX + x] == pi2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1b6,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                if ((local_224 < B44_COMPRESSION) &&
                   ((fVar1 = *(float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)
                                               ((long)pf->_data +
                                               uVar43 * 2 + lVar30 * 2 + pf->_sizeY * local_220) * 4
                                       ),
                    pfVar20 = (float *)(_imath_half_to_float_table +
                                       (ulong)*(ushort *)(local_1e0 + uVar43 * 2) * 4),
                    fVar1 != *pfVar20 || (NAN(fVar1) || NAN(*pfVar20))))) {
                  __assert_fail("ph1[oY + y][oX + x] == ph2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1bd,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
                bVar4 = equivalent(*(float *)(*(long *)(lVar39 + 8) * lVar49 +
                                              *(long *)(lVar39 + 0x10) + lVar30 * 4 + uVar43 * 4),
                                   *(float *)(pcVar46 + uVar43 * 4),local_224);
                if (!bVar4) {
                  __assert_fail("equivalent (pf1[oY + y][oX + x], pf2[y][x], comp)",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testTiledCompression.cpp"
                                ,0x1c1,
                                "void (anonymous namespace)::writeRead(const Array2D<unsigned int> &, const Array2D<half> &, const Array2D<float> &, const char *, LineOrder, int, int, int, int, int, int, Compression)"
                               );
                }
              } while ((uVar43 < 0xe) &&
                      (iVar3 = (int)uVar43, uVar43 = uVar43 + 1, iVar58 + iVar3 < (int)uStack_90));
            }
            if (0xd < uVar40) break;
            uVar40 = uVar40 + 1;
            local_1e0 = local_1e0 + 0x1e;
            pcVar46 = pcVar46 + 0x3c;
            pcVar34 = pcVar34 + 0x3c;
            local_220 = local_220 + 2;
            lVar49 = lVar49 + 4;
            bVar4 = iVar7 < uStack_90._4_4_;
            iVar7 = iVar7 + 1;
          } while (bVar4);
        }
        iVar6 = iVar6 + 1;
      }
    }
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&fb);
    operator_delete__(pcVar27);
    operator_delete__(pcVar26);
    operator_delete__(pcVar13);
    Imf_3_2::TiledInputFile::~TiledInputFile((TiledInputFile *)&ph4);
    remove(__filename._M_p);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    Imf_3_2::Header::~Header(&hdr);
    local_224 = local_224 + RLE_COMPRESSION;
    if (local_224 == NUM_COMPRESSION_METHODS) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)filename._M_dataplus._M_p != &filename.field_2) {
        operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void
writeRead (
    const std::string&           tempDir,
    const Array2D<unsigned int>& pi,
    const Array2D<half>&         ph,
    const Array2D<float>&        pf,
    int                          w,
    int                          h,
    int                          xs,
    int                          ys,
    int                          dx,
    int                          dy)
{
    std::string filename = tempDir + "imf_test_comp.exr";

    for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
    {
        writeRead (
            pi,
            ph,
            pf,
            filename.c_str (),
            LineOrder (0),
            w,
            h,
            xs,
            ys,
            dx,
            dy,
            Compression (comp));
    }
}